

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  cmsys::RegularExpression::RegularExpression(&this->Regex,(regex->_M_dataplus)._M_p);
  (this->Properties).Exclude = false;
  (this->Properties).Permissions = 0;
  std::__cxx11::string::string((string *)&this->RegexString,(string *)regex);
  return;
}

Assistant:

MatchRule(std::string const& regex):
      Regex(regex.c_str()), RegexString(regex) {}